

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::AddTracedSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  pointer *pppTVar1;
  cmTargetInternals *pcVar2;
  iterator __position;
  cmGeneratorExpression cVar3;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string srcFiles;
  cmListFileBacktrace lfbt;
  cmGeneratorExpression local_80;
  auto_ptr<cmCompiledGeneratorExpression> local_78;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  cmListFileBacktrace local_40;
  
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)(local_70 + 0x10),srcs,";");
  if (local_70._24_8_ != 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&(((this->Internal).Pointer)->SourceFilesMap)._M_t);
    this->LinkImplementationLanguageIsContextDependent = true;
    cmMakefile::GetBacktrace(&local_40,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_70,&local_40);
    cmGeneratorExpression::Parse(&local_80,(string *)local_70);
    cVar3.Backtrace = local_80.Backtrace;
    local_80.Backtrace = (cmListFileBacktrace *)0x0;
    local_78.x_ = (cmCompiledGeneratorExpression *)cVar3.Backtrace;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_80);
    *(undefined1 *)
     &cVar3.Backtrace[8].super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish = 1;
    pcVar2 = (this->Internal).Pointer;
    local_80.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
    local_78.x_ = (cmCompiledGeneratorExpression *)0x0;
    local_70._8_8_ = 0;
    (((cmCompiledGeneratorExpression *)local_80.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)cVar3.Backtrace;
    (((cmCompiledGeneratorExpression *)local_80.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    __position._M_current =
         (pcVar2->SourceEntries).
         super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pcVar2->SourceEntries).
        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar2->SourceEntries,__position,(TargetPropertyEntry **)&local_80);
    }
    else {
      *__position._M_current = (TargetPropertyEntry *)local_80.Backtrace;
      pppTVar1 = &(pcVar2->SourceEntries).
                  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_70 + 8));
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_78);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_70);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              (&local_40.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._16_8_ != &local_50) {
    operator_delete((void *)local_70._16_8_,local_50._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTarget::AddTracedSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles = cmJoin(srcs, ";");
  if (!srcFiles.empty())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(srcFiles);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
}